

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_sse.cpp
# Opt level: O0

float * Resample_<FastBSincTag,SSETag>
                  (InterpState *state,float *src,uint frac,uint increment,
                  span<float,_18446744073709551615UL> dst)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  iterator pfVar11;
  long lVar12;
  pointer pfVar13;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  float fVar14;
  __m128 f4;
  size_t j;
  size_t td;
  float *phd;
  float *fil;
  __m128 pf4;
  __m128 r4;
  float pf;
  uint pi;
  float *out_sample;
  iterator __end1;
  iterator __begin1;
  span<float,_18446744073709551615UL> *__range1;
  size_t m;
  float *filter;
  long local_1e8;
  ulong local_1e0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  iterator local_190;
  uint local_16c;
  long local_168;
  span<float,_18446744073709551615UL> local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar2 = *(long *)(in_RDI + 0x10);
  uVar1 = *(uint *)(in_RDI + 4);
  local_168 = in_RSI + (ulong)*(uint *)(in_RDI + 8) * -4;
  local_190 = al::span<float,_18446744073709551615UL>::begin(&local_158);
  pfVar11 = al::span<float,_18446744073709551615UL>::end(&local_158);
  local_16c = in_EDX;
  for (; local_190 != pfVar11; local_190 = local_190 + 1) {
    local_148 = (float)(local_16c & 0x7f) * 0.0078125;
    local_128 = 0;
    uStack_120 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_58 = CONCAT44(local_148,local_148);
    uStack_50 = CONCAT44(local_148,local_148);
    lVar12 = lVar2 + (ulong)uVar1 * (ulong)(local_16c >> 7) * 0x10;
    local_1e0 = (ulong)(uVar1 >> 2);
    local_1e8 = 0;
    do {
      local_90 = (undefined8 *)(lVar12 + local_1e8 * 4);
      uVar3 = *local_90;
      uVar4 = local_90[1];
      local_98 = (undefined8 *)(lVar12 + (ulong)uVar1 * 4 + local_1e8 * 4);
      uVar5 = *local_98;
      uVar6 = local_98[1];
      local_68._0_4_ = (float)uVar5;
      local_68._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_60._0_4_ = (float)uVar6;
      uStack_60._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_b8 = local_148 * (float)local_68;
      fStack_b4 = local_148 * local_68._4_4_;
      fStack_b0 = local_148 * (float)uStack_60;
      fStack_ac = local_148 * uStack_60._4_4_;
      local_a8._0_4_ = (float)uVar3;
      local_a8._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_a0._0_4_ = (float)uVar4;
      uStack_a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
      uVar7 = local_1b8;
      uVar8 = uStack_1b0;
      local_78 = CONCAT44(local_a8._4_4_ + fStack_b4,(float)local_a8 + local_b8);
      uStack_70 = CONCAT44(uStack_a0._4_4_ + fStack_ac,(float)uStack_a0 + fStack_b0);
      local_40 = (undefined8 *)(local_168 + local_1e8 * 4);
      uVar9 = *local_40;
      uVar10 = local_40[1];
      local_88._0_4_ = (float)uVar9;
      local_88._4_4_ = (float)((ulong)uVar9 >> 0x20);
      uStack_80._0_4_ = (float)uVar10;
      uStack_80._4_4_ = (float)((ulong)uVar10 >> 0x20);
      local_d8 = ((float)local_a8 + local_b8) * (float)local_88;
      fStack_d4 = (local_a8._4_4_ + fStack_b4) * local_88._4_4_;
      fStack_d0 = ((float)uStack_a0 + fStack_b0) * (float)uStack_80;
      fStack_cc = (uStack_a0._4_4_ + fStack_ac) * uStack_80._4_4_;
      local_c8._0_4_ = (float)local_1b8;
      local_c8._4_4_ = (float)((ulong)local_1b8 >> 0x20);
      uStack_c0._0_4_ = (float)uStack_1b0;
      uStack_c0._4_4_ = (float)((ulong)uStack_1b0 >> 0x20);
      fStack_ec = (float)local_c8 + local_d8;
      fStack_f0 = local_c8._4_4_ + fStack_d4;
      fStack_f4 = (float)uStack_c0 + fStack_d0;
      local_f8 = uStack_c0._4_4_ + fStack_cc;
      local_1b8 = CONCAT44(fStack_f0,fStack_ec);
      uStack_1b0 = CONCAT44(local_f8,fStack_f4);
      local_1e8 = local_1e8 + 4;
      local_1e0 = local_1e0 - 1;
    } while (local_1e0 != 0);
    local_118 = fStack_f4 + fStack_f0;
    fStack_114 = local_f8 + fStack_ec;
    local_1b8 = CONCAT44(fStack_f0 + fStack_f4,fStack_ec + local_f8);
    uStack_1b0 = CONCAT44(fStack_114,local_118);
    local_108 = local_1b8;
    uStack_100 = uStack_1b0;
    fVar14 = fStack_ec + local_f8 + local_118;
    local_1b8 = CONCAT44(fStack_f0 + fStack_f4 + fStack_114,fVar14);
    uStack_1b0 = CONCAT44(fStack_114 + fStack_114,local_118 + local_118);
    local_18 = local_1b8;
    uStack_10 = uStack_1b0;
    *local_190 = fVar14;
    local_168 = local_168 + (ulong)(in_ECX + local_16c >> 0xc) * 4;
    local_16c = in_ECX + local_16c & 0xfff;
    fStack_144 = local_148;
    fStack_140 = local_148;
    fStack_13c = local_148;
    local_12c = local_148;
    fStack_110 = local_118;
    fStack_10c = fStack_114;
    local_e8 = fStack_ec;
    fStack_e4 = fStack_f0;
    fStack_e0 = fStack_f4;
    fStack_dc = local_f8;
    local_c8 = uVar7;
    uStack_c0 = uVar8;
    local_a8 = uVar3;
    uStack_a0 = uVar4;
    local_88 = uVar9;
    uStack_80 = uVar10;
    local_68 = uVar5;
    uStack_60 = uVar6;
    local_38 = local_108;
    uStack_30 = uStack_100;
    local_28 = local_108;
    uStack_20 = uStack_100;
  }
  pfVar13 = al::span<float,_18446744073709551615UL>::data(&local_158);
  return pfVar13;
}

Assistant:

const float *Resample_<FastBSincTag,SSETag>(const InterpState *state, const float *RESTRICT src,
    uint frac, uint increment, const al::span<float> dst)
{
    const float *const filter{state->bsinc.filter};
    const size_t m{state->bsinc.m};

    src -= state->bsinc.l;
    for(float &out_sample : dst)
    {
        // Calculate the phase index and factor.
        const uint pi{frac >> FracPhaseBitDiff};
        const float pf{static_cast<float>(frac & (FracPhaseDiffOne-1)) * (1.0f/FracPhaseDiffOne)};

        // Apply the phase interpolated filter.
        __m128 r4{_mm_setzero_ps()};
        {
            const __m128 pf4{_mm_set1_ps(pf)};
            const float *fil{filter + m*pi*4};
            const float *phd{fil + m};
            size_t td{m >> 2};
            size_t j{0u};

            do {
                /* f = fil + pf*phd */
                const __m128 f4 = MLA4(_mm_load_ps(&fil[j]), pf4, _mm_load_ps(&phd[j]));
                /* r += f*src */
                r4 = MLA4(r4, f4, _mm_loadu_ps(&src[j]));
                j += 4;
            } while(--td);
        }
        r4 = _mm_add_ps(r4, _mm_shuffle_ps(r4, r4, _MM_SHUFFLE(0, 1, 2, 3)));
        r4 = _mm_add_ps(r4, _mm_movehl_ps(r4, r4));
        out_sample = _mm_cvtss_f32(r4);

        frac += increment;
        src  += frac>>MixerFracBits;
        frac &= MixerFracMask;
    }
    return dst.data();
}